

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeom_utility.h
# Opt level: O2

int ProjectInParametricDomain<pzgeom::TPZEllipse3D>(TPZVec<double> *qsi,TPZVec<double> *qsiInDomain)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int sideto;
  long lVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double local_3f0;
  TPZManVector<double,_3> pt2;
  TPZManVector<double,_3> pt1;
  TPZTransform<double> T2;
  TPZTransform<double> T1;
  
  bVar1 = pztopology::TPZLine::IsInParametricDomain(qsi,0.0);
  if (bVar1) {
    iVar5 = 2;
    TPZVec<double>::operator=(qsiInDomain,qsi);
  }
  else {
    TPZManVector<double,_3>::TPZManVector(&pt1,qsi->fNElements);
    TPZManVector<double,_3>::TPZManVector(&pt2,qsi->fNElements);
    local_3f0 = 1000000000000.0;
    iVar5 = -1;
    for (sideto = 0; sideto != 2; sideto = sideto + 1) {
      pztopology::TPZLine::SideToSideTransform(&T1,2,sideto);
      iVar2 = pztopology::TPZLine::SideDimension(sideto);
      TPZManVector<double,_3>::Resize(&pt1,(long)iVar2);
      TPZTransform<double>::Apply(&T1,qsi,&pt1.super_TPZVec<double>);
      bVar1 = IsInSideParametricDomain<pzgeom::TPZEllipse3D>(sideto,&pt1.super_TPZVec<double>,0.0);
      if (bVar1) {
        pztopology::TPZLine::SideToSideTransform(&T2,sideto,2);
        TPZTransform<double>::Apply(&T2,&pt1.super_TPZVec<double>,&pt2.super_TPZVec<double>);
        lVar3 = qsi->fNElements;
        if (lVar3 < 1) {
          lVar3 = 0;
        }
        dVar6 = 0.0;
        for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
          dVar7 = qsi->fStore[lVar4] - pt2.super_TPZVec<double>.fStore[lVar4];
          dVar6 = dVar6 + dVar7 * dVar7;
        }
        if (dVar6 < 0.0) {
          dVar6 = sqrt(dVar6);
        }
        else {
          dVar6 = SQRT(dVar6);
        }
        if (dVar6 < local_3f0) {
          TPZVec<double>::operator=(qsiInDomain,&pt2.super_TPZVec<double>);
          local_3f0 = dVar6;
          iVar5 = sideto;
        }
        TPZTransform<double>::~TPZTransform(&T2);
      }
      TPZTransform<double>::~TPZTransform(&T1);
    }
    TPZManVector<double,_3>::~TPZManVector(&pt2);
    TPZManVector<double,_3>::~TPZManVector(&pt1);
  }
  return iVar5;
}

Assistant:

int ProjectInParametricDomain(TPZVec<REAL> &qsi, TPZVec<REAL> &qsiInDomain){
    const int nsides = Topology::NSides;
    if(Topology::IsInParametricDomain(qsi,0.)){///it is already in the domain
        qsiInDomain = qsi;
        return nsides-1;
    }//if
    
    int winnerSide = -1;
    REAL winnerDistance = 1e12;
    TPZManVector<REAL,3> pt1(qsi.NElements()), pt2(qsi.NElements());
    for(int is = 0; is < nsides-1; is++){
        
        ///Go from NSides-1 to side is
        TPZTransform<> T1 = Topology::SideToSideTransform(nsides-1, is);
        pt1.Resize(Topology::SideDimension(is));
        T1.Apply(qsi,pt1);
        
        ///Check if the point is within side boundaries
        bool IsInSideDomain = IsInSideParametricDomain<Topology>(is,pt1,0.);
        if(!IsInSideDomain) continue;
        
        ///Come back from side is to \f$ NSides-1 \f$
        TPZTransform<> T2 = Topology::SideToSideTransform(is,nsides-1);
        T2.Apply(pt1,pt2);
        
        ///Compare original to mapped point
        REAL distance = 0.;
        for(int i = 0; i < qsi.NElements(); i++){
            REAL val = qsi[i]-pt2[i];
            distance += val*val;
        }//i
        distance = sqrt(distance);
        
        ///The closest side point to the original is the projected point
        if(distance < winnerDistance){
            winnerDistance = distance;
            winnerSide = is;
            qsiInDomain = pt2;
        }
    }//for is
    
    return winnerSide;
    
}